

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitIf
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,IfExpr e)

{
  bool bVar1;
  byte bVar2;
  ExprBase EVar3;
  long in_RDI;
  bool has_else;
  NumericExpr else_expr;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>
  *in_stack_ffffffffffffff68;
  BasicStringRef<char> *in_stack_ffffffffffffff70;
  ExprBase expr;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  BasicStringRef<char> in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  ExprBase in_stack_ffffffffffffffc0;
  ExprBase e_00;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>::condition
            (in_stack_ffffffffffffff68);
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)
        CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
        (LogicalExpr)in_stack_ffffffffffffffc0.impl_,iVar4);
  expr.impl_ = *(Impl **)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  EVar3.impl_ = (Impl *)BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>
                        ::else_expr(in_stack_ffffffffffffff68);
  e_00.impl_ = EVar3.impl_;
  bVar1 = IsZero<mp::internal::ExprTypes,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                    ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)expr.impl_);
  iVar4 = (int)((ulong)EVar3.impl_ >> 0x20);
  bVar2 = (bVar1 ^ 0xffU) & 1;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>::then_expr
            (in_stack_ffffffffffffff68);
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)
        CONCAT17(bVar2,in_stack_ffffffffffffffb8),(NumericExpr)e_00.impl_,iVar4);
  if ((bVar2 & 1) != 0) {
    fmt::BasicStringRef<char>::BasicStringRef
              (*(BasicStringRef<char> **)(in_RDI + 8),(char *)in_stack_ffffffffffffff68);
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
    Visit((ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *)
          CONCAT17(bVar2,in_stack_ffffffffffffffb8),(NumericExpr)e_00.impl_,iVar4);
  }
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIf(IfExpr e) {
  writer_ << "if ";
  Visit(e.condition(), prec::UNKNOWN);
  writer_ << " then ";
  NumericExpr else_expr = e.else_expr();
  bool has_else = !IsZero<ExprTypes>(else_expr);
  Visit(e.then_expr(), prec::CONDITIONAL + (has_else ? 1 : 0));
  if (has_else) {
    writer_ << " else ";
    Visit(else_expr);
  }
}